

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
program_options::invalid_bool_value::invalid_bool_value(invalid_bool_value *this,string *bad_value)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_52);
  validation_error::validation_error
            (&this->super_validation_error,invalid_bool_value,&local_50,&local_30,0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&(this->super_validation_error).super_error_with_option_name.super_error =
       &PTR__error_with_option_name_00121b80;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"value",(allocator<char> *)&local_30);
  error_with_option_name::set_substitute((error_with_option_name *)this,&local_50,bad_value);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

invalid_bool_value::invalid_bool_value(const std::string& bad_value)
: validation_error(validation_error::invalid_bool_value)
{
    set_substitute("value", bad_value);
}